

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

void __thiscall cg_other::set(cg_other *this,point p,int ch)

{
  pointer *ppcVar1;
  iterator __position;
  pointer pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  cgo_char local_10;
  
  pcVar2 = (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = (long)__position._M_current - (long)pcVar2 != 0;
  if (bVar6) {
    if (pcVar2->p != p) {
      uVar3 = ((long)__position._M_current - (long)pcVar2 >> 2) * -0x5555555555555555;
      uVar4 = 1;
      do {
        uVar5 = (ulong)uVar4;
        bVar7 = uVar3 - uVar5 == 0;
        bVar6 = uVar3 >= uVar5 && !bVar7;
        if (uVar3 < uVar5 || bVar7) goto LAB_0010babc;
        uVar4 = uVar4 + 1;
      } while (pcVar2[uVar5].p != p);
      pcVar2 = pcVar2 + uVar5;
    }
    pcVar2->ch = ch;
    if (bVar6) {
      return;
    }
  }
LAB_0010babc:
  if (__position._M_current ==
      (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.p = p;
    local_10.ch = ch;
    std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
    _M_realloc_insert<cg_other::cgo_char>(&this->data,__position,&local_10);
  }
  else {
    (__position._M_current)->ch = ch;
    (__position._M_current)->p = p;
    ppcVar1 = &(this->data).
               super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

void cg_other::set(point p, int ch) { //TODO
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) {
            data[i].ch = ch;
            return;
        }
    }
    data.push_back({ p, ch });
}